

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

TestNode *
deqp::gls::Functional::ScissorTestInternal::createClearTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          deUint32 clearMode)

{
  ScissorClearCase *this;
  deUint32 clearMode_local;
  Vec4 *scissorArea_local;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  
  this = (ScissorClearCase *)operator_new(0x90);
  anon_unknown_0::ScissorClearCase::ScissorClearCase
            (this,testCtx,renderCtx,name,desc,scissorArea,clearMode);
  return (TestNode *)this;
}

Assistant:

tcu::TestNode* createClearTest (tcu::TestContext&	testCtx,
								glu::RenderContext&	renderCtx,
								const char*			name,
								const char*			desc,
								const Vec4&			scissorArea,
								deUint32			clearMode)
{
	return new ScissorClearCase(testCtx, renderCtx, name, desc, scissorArea, clearMode);
}